

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_send(Curl_easy *data,ssize_t len,size_t upload_size)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  ssize_t bytes_written;
  size_t local_20;
  
  pcVar1 = data->conn;
  CVar2 = Curl_nwrite(data,0,(data->state).ulbuf,len,(ssize_t *)&local_20);
  if (CVar2 == CURLE_OK) {
    if (local_20 != len) {
      (pcVar1->proto).ftpc.pp.sendbuf.bufr = (char *)len;
      (pcVar1->proto).ftpc.pp.sendbuf.leng = local_20;
    }
    (pcVar1->proto).ftpc.pp.response_time = upload_size;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode smb_send(struct Curl_easy *data, ssize_t len,
                         size_t upload_size)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  ssize_t bytes_written;
  CURLcode result;

  result = Curl_nwrite(data, FIRSTSOCKET, data->state.ulbuf,
                      len, &bytes_written);
  if(result)
    return result;

  if(bytes_written != len) {
    smbc->send_size = len;
    smbc->sent = bytes_written;
  }

  smbc->upload_size = upload_size;

  return CURLE_OK;
}